

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O3

void __thiscall kj::_::anon_unknown_0::TestCase270::run(TestCase270 *this)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  size_t __n;
  long *plVar4;
  int *in_R8;
  int line;
  int i;
  Exception exception;
  int local_1a4;
  Type local_1a0;
  char local_19c [4];
  StringPtr local_198;
  String local_188;
  Exception local_170;
  
  local_19c[0] = '{';
  local_19c[1] = '\0';
  local_19c[2] = '\0';
  local_19c[3] = '\0';
  local_1a4 = 0x111;
  Debug::makeDescription<char_const(&)[4],int&>
            (&local_188,(Debug *)"\"foo\", i","foo",&local_19c,in_R8);
  Exception::Exception
            (&local_170,DISCONNECTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,0x111,&local_188);
  sVar2 = local_188.content.size_;
  pcVar1 = local_188.content.ptr;
  if (local_188.content.ptr != (char *)0x0) {
    local_188.content.ptr = (char *)0x0;
    local_188.content.size_ = 0;
    (**(local_188.content.disposer)->_vptr_ArrayDisposer)
              (local_188.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_170.type != DISCONNECTED) && (Debug::minSeverity < 3)) {
    local_198.content.ptr = (char *)CONCAT44(local_198.content.ptr._4_4_,2);
    local_1a0 = local_170.type;
    Debug::log<char_const(&)[74],kj::Exception::Type,kj::Exception::Type>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x113,ERROR,
               "\"failed: expected \" \"(Exception::Type::DISCONNECTED) == (exception.getType())\", Exception::Type::DISCONNECTED, exception.getType()"
               ,(char (*) [74])
                "failed: expected (Exception::Type::DISCONNECTED) == (exception.getType())",
               (Type *)&local_198,&local_1a0);
  }
  __n = strlen(local_170.file);
  if (__n - 0x69 < 0xffffffffffffff96) {
    if (2 < Debug::minSeverity) goto LAB_0015da67;
LAB_0015d9fb:
    Debug::log<char_const(&)[169]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x114,ERROR,
               "\"failed: expected \" \"kj::StringPtr(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\\\").endsWith(exception.getFile())\""
               ,(char (*) [169])
                "failed: expected kj::StringPtr(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\").endsWith(exception.getFile())"
              );
  }
  else {
    iVar3 = bcmp("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                 + (0x68 - __n),local_170.file,__n);
    if (iVar3 != 0 && Debug::minSeverity < 3) goto LAB_0015d9fb;
  }
  if ((local_170.line != 0x111) && (Debug::minSeverity < 3)) {
    local_198.content.ptr = (char *)CONCAT44(local_198.content.ptr._4_4_,local_170.line);
    Debug::log<char_const(&)[49],int&,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x115,ERROR,
               "\"failed: expected \" \"(line) == (exception.getLine())\", line, exception.getLine()"
               ,(char (*) [49])"failed: expected (line) == (exception.getLine())",&local_1a4,
               (int *)&local_198);
  }
LAB_0015da67:
  plVar4 = (long *)0x199111;
  if (local_170.description.content.size_ != 0) {
    plVar4 = (long *)local_170.description.content.ptr;
  }
  if (((local_170.description.content.size_ != 0xd) ||
      ((int)*(long *)((long)local_170.description.content.ptr + 8) != 0x33323120 ||
       *(long *)local_170.description.content.ptr != 0x3d2069203b6f6f66)) &&
     (Debug::minSeverity < 3)) {
    local_198.content.ptr = (char *)plVar4;
    local_198.content.size_ =
         local_170.description.content.size_ + (local_170.description.content.size_ == 0);
    Debug::log<char_const(&)[66],char_const(&)[13],kj::StringPtr>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x116,ERROR,
               "\"failed: expected \" \"(\\\"foo; i = 123\\\") == (exception.getDescription())\", \"foo; i = 123\", exception.getDescription()"
               ,(char (*) [66])"failed: expected (\"foo; i = 123\") == (exception.getDescription())"
               ,(char (*) [13])"foo; i = 123",&local_198);
  }
  Exception::~Exception(&local_170);
  return;
}

Assistant:

TEST(Debug, Exception) {
  int i = 123;

  int line = __LINE__; Exception exception = KJ_EXCEPTION(DISCONNECTED, "foo", i);

  EXPECT_EQ(Exception::Type::DISCONNECTED, exception.getType());
  EXPECT_TRUE(kj::StringPtr(__FILE__).endsWith(exception.getFile()));
  EXPECT_EQ(line, exception.getLine());
  EXPECT_EQ("foo; i = 123", exception.getDescription());
}